

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
wallet::anon_unknown_5::WalletImpl::lockCoin(WalletImpl *this,COutPoint *output,bool write_to_db)

{
  bool bVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)(local_38 + 8),
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x103,false);
  if ((int)CONCAT71(in_register_00000011,write_to_db) == 0) {
    local_38._0_8_ = (WalletBatch *)0x0;
  }
  else {
    CWallet::GetDatabase
              ((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>((WalletDatabase *)local_38);
  }
  bVar1 = CWallet::LockCoin((this->m_wallet).
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            output,(WalletBatch *)local_38._0_8_);
  std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::~unique_ptr
            ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)local_38)
  ;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)(local_38 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool lockCoin(const COutPoint& output, const bool write_to_db) override
    {
        LOCK(m_wallet->cs_wallet);
        std::unique_ptr<WalletBatch> batch = write_to_db ? std::make_unique<WalletBatch>(m_wallet->GetDatabase()) : nullptr;
        return m_wallet->LockCoin(output, batch.get());
    }